

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DT_TriEdge.cpp
# Opt level: O3

bool __thiscall
sch::Depth_Edge::silhouette
          (Depth_Edge *this,Vector3 *verts,Index_t index,Depth_TriangleStore *triangleStore)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  bool bVar5;
  Depth_Triangle *pDVar6;
  Index_t i1;
  Index_t i2;
  Depth_Edge local_40;
  
  pDVar6 = this->m_triangle;
  if (pDVar6->m_obsolete != false) {
    return true;
  }
  dVar1 = (pDVar6->m_closest).m_x;
  dVar2 = (pDVar6->m_closest).m_y;
  dVar3 = (pDVar6->m_closest).m_z;
  if (0.0 < (verts[index].m_z - dVar3) * dVar3 +
            (verts[index].m_x - dVar1) * dVar1 + (verts[index].m_y - dVar2) * dVar2) {
    pDVar6->m_obsolete = true;
    iVar4 = triangleStore->m_free;
    bVar5 = silhouette(pDVar6->m_adjEdges + (this->m_index + ((this->m_index + 1) / 3) * -3 + 1),
                       verts,index,triangleStore);
    pDVar6 = this->m_triangle;
    if (!bVar5) {
      pDVar6->m_obsolete = false;
      i1 = pDVar6->m_indices[(this->m_index + 1) % 3];
      i2 = pDVar6->m_indices[this->m_index];
      goto LAB_00175322;
    }
    bVar5 = silhouette(pDVar6->m_adjEdges + (this->m_index + ((this->m_index + 2) / 3) * -3 + 2),
                       verts,index,triangleStore);
    if (bVar5) {
      return true;
    }
    pDVar6 = this->m_triangle;
    pDVar6->m_obsolete = false;
    triangleStore->m_free = iVar4;
  }
  i1 = pDVar6->m_indices[(this->m_index + 1) % 3];
  i2 = pDVar6->m_indices[this->m_index];
LAB_00175322:
  local_40.m_triangle = Depth_TriangleStore::newTriangle(triangleStore,verts,index,i1,i2);
  bVar5 = local_40.m_triangle != (Depth_Triangle *)0x0;
  if (bVar5) {
    local_40.m_index = 1;
    half_link(&local_40,this);
  }
  return bVar5;
}

Assistant:

bool Depth_Edge::silhouette(const Vector3 * verts, Index_t index, Depth_TriangleStore & triangleStore) const
{
  if(!m_triangle->isObsolete())
  {
    if(!m_triangle->isVisibleFrom(verts, index))
    {
      Depth_Triangle * triangle = triangleStore.newTriangle(verts, index, getTarget(), getSource());

      if(triangle)
      {
        half_link(Depth_Edge(triangle, 1), *this);
        return true;
      }

      return false;
    }
    else
    {
      m_triangle->setObsolete(true); // Triangle is visible

      int backup = triangleStore.getFree();

      if(!m_triangle->getAdjEdge(circ_next(m_index)).silhouette(verts, index, triangleStore))
      {
        m_triangle->setObsolete(false);

        Depth_Triangle * triangle = triangleStore.newTriangle(verts, index, getTarget(), getSource());

        if(triangle)
        {
          half_link(Depth_Edge(triangle, 1), *this);
          return true;
        }

        return false;
      }
      else if(!m_triangle->getAdjEdge(circ_prev(m_index)).silhouette(verts, index, triangleStore))
      {
        m_triangle->setObsolete(false);

        triangleStore.setFree(backup);

        Depth_Triangle * triangle = triangleStore.newTriangle(verts, index, getTarget(), getSource());

        if(triangle)
        {
          half_link(Depth_Edge(triangle, 1), *this);
          return true;
        }

        return false;
      }
    }
  }

  return true;
}